

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

TapBranch * __thiscall
cfd::core::DescriptorNode::GetTapBranch
          (TapBranch *__return_storage_ptr__,DescriptorNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *array_argument)

{
  long lVar1;
  pointer pbVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  ulong uVar5;
  mapped_type *this_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __i;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  pointer pbVar8;
  TapBranch *tree;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  key_list;
  string desc;
  Script first_script;
  string target;
  Script script;
  DescriptorKeyReference ref;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>_>
  *local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  Script local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  string local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  Script local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  DescriptorScriptReference local_380;
  
  local_4b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4a0 = &this->tree_node_;
  for (p_Var4 = (this->tree_node_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pbVar2 = local_4b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
      pbVar8 = local_4b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      (_Rb_tree_header *)p_Var4 != &(this->tree_node_)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)::std::_Rb_tree_increment(p_Var4)) {
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_4b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 1));
  }
  if (local_4b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_4b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar6 = (long)local_4b8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_4b8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = lVar6 >> 5;
    lVar1 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cfd::core::DescriptorNode::GetTapBranch(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*)const::__0>>
              (local_4b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_4b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar6 < 0x201) {
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<cfd::core::DescriptorNode::GetTapBranch(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*)const::__0>>
                (pbVar8,pbVar2);
    }
    else {
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pbVar8 + 0x10);
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<cfd::core::DescriptorNode::GetTapBranch(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*)const::__0>>
                (pbVar8,pbVar7);
      for (; pbVar7 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar2;
          pbVar7 = pbVar7 + 1) {
        ::std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Val_comp_iter<cfd::core::DescriptorNode::GetTapBranch(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*)const::__0>>
                  (pbVar7);
      }
    }
  }
  ::std::__cxx11::string::string((string *)&local_490,(string *)&this->value_);
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  local_438._M_string_length = 0;
  local_438.field_2._M_local_buf[0] = '\0';
  Script::Script(&local_470);
  local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar8 = local_4b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar8 != (pointer)local_498;
      pbVar8 = (pointer)((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar8
                        + 1)) {
    this_00 = ::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>_>
              ::at(local_4a0,(key_type *)pbVar8);
    if (this_00->node_type_ == kDescriptorTypeKey) {
      GetKeyReferences((DescriptorKeyReference *)&local_380,this_00,array_argument);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_3f8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_380.locking_script_
                );
      SchnorrPubkey::GetHex_abi_cxx11_((string *)&local_3d8,(SchnorrPubkey *)&local_3f8);
      ::std::__cxx11::string::operator=((string *)&local_438,(string *)&local_3d8);
      ::std::__cxx11::string::~string((string *)&local_3d8);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_3f8);
      DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)&local_380);
    }
    else {
      GetReference(&local_380,this_00,array_argument,(DescriptorNode *)0x0);
      bVar3 = DescriptorScriptReference::HasRedeemScript(&local_380);
      Script::Script(&local_3d8,(Script *)((long)&local_380.locking_script_ + (ulong)bVar3 * 0x40));
      bVar3 = Script::IsEmpty(&local_470);
      if (bVar3) {
        Script::operator=(&local_470,&local_3d8);
      }
      Script::GetHex_abi_cxx11_(&local_418,&local_3d8);
      ::std::operator+(&local_3a0,"tl(",&local_418);
      ::std::operator+(&local_3f8,&local_3a0,")");
      ::std::__cxx11::string::operator=((string *)&local_438,(string *)&local_3f8);
      ::std::__cxx11::string::~string((string *)&local_3f8);
      ::std::__cxx11::string::~string((string *)&local_3a0);
      ::std::__cxx11::string::~string((string *)&local_418);
      Script::~Script(&local_3d8);
      DescriptorScriptReference::~DescriptorScriptReference(&local_380);
    }
    bVar3 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              pbVar8,&local_438);
    if (bVar3) {
      while (uVar5 = ::std::__cxx11::string::find((string *)&local_490,(ulong)pbVar8),
            uVar5 != 0xffffffffffffffff) {
        ::std::__cxx11::string::replace
                  ((ulong)&local_490,uVar5,
                   (string *)
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar8)->
                   _M_string_length);
        ::std::__cxx11::string::_M_assign((string *)&local_490);
      }
    }
  }
  TapBranch::TapBranch(__return_storage_ptr__);
  if ((local_490._M_string_length != 0) && (bVar3 = ::std::operator==(&local_490,"{}"), !bVar3)) {
    TapBranch::FromString((TapBranch *)&local_380,&local_490);
    TapBranch::operator=(__return_storage_ptr__,(TapBranch *)&local_380);
    TapBranch::~TapBranch((TapBranch *)&local_380);
    bVar3 = TapBranch::HasTapLeaf(__return_storage_ptr__);
    if ((!bVar3) && (bVar3 = Script::IsEmpty(&local_470), !bVar3)) {
      local_3d8._vptr_Script = (_func_int **)0x0;
      local_3d8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3d8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      TapBranch::ChangeTapLeaf
                ((TapBranch *)&local_380,__return_storage_ptr__,&local_470,
                 (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                 &local_3d8);
      TapBranch::operator=(__return_storage_ptr__,(TapBranch *)&local_380);
      TapBranch::~TapBranch((TapBranch *)&local_380);
      ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                 &local_3d8);
    }
  }
  Script::~Script(&local_470);
  ::std::__cxx11::string::~string((string *)&local_438);
  ::std::__cxx11::string::~string((string *)&local_490);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4b8);
  return __return_storage_ptr__;
}

Assistant:

TapBranch DescriptorNode::GetTapBranch(
    std::vector<std::string>* array_argument) const {
  static auto sort_func = [](const std::string& src, const std::string& dest) {
    return src.length() > dest.length();
  };
  std::vector<std::string> key_list;
  for (const auto& tree_node : tree_node_) {
    key_list.emplace_back(tree_node.first);
  }
  std::sort(key_list.begin(), key_list.end(), sort_func);

  std::string desc = value_;
  std::string target;
  Script first_script;
  for (const auto& script_str : key_list) {
    const auto& node_ref = tree_node_.at(script_str);
    if (node_ref.node_type_ == DescriptorNodeType::kDescriptorTypeKey) {
      auto ref = node_ref.GetKeyReferences(array_argument);
      target = ref.GetSchnorrPubkey().GetHex();
    } else {
      const auto obj = node_ref.GetReference(array_argument);
      Script script = obj.HasRedeemScript() ? obj.GetRedeemScript()
                                            : obj.GetLockingScript();
      if (first_script.IsEmpty()) first_script = script;
      target = "tl(" + script.GetHex() + ")";
    }
    if (script_str != target) {
      auto offset = desc.find(script_str);
      while (offset != std::string::npos) {
        desc = desc.replace(offset, script_str.length(), target);
        offset = desc.find(script_str);
      }
    }
  }

  TapBranch tree;
  if (desc.empty() || (desc == "{}")) {
    // do nothing
  } else {
    tree = TapBranch::FromString(desc);
    if ((!tree.HasTapLeaf()) && (!first_script.IsEmpty())) {
      tree = tree.ChangeTapLeaf(first_script);
    }
  }
  return tree;
}